

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamIndexFactory_p.cpp
# Opt level: O0

BamIndex *
BamTools::Internal::BamIndexFactory::CreateIndexFromFilename
          (string *indexFilename,BamReaderPrivate *reader)

{
  __type _Var1;
  byte bVar2;
  ulong uVar3;
  BamIndex *pBVar4;
  string extension;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  string local_90 [8];
  BamReaderPrivate *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined4 local_3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  BamIndex *local_8;
  
  FileExtension((string *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    BamStandardIndex::Extension_abi_cxx11_();
    _Var1 = std::operator==(&local_38,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    if (_Var1) {
      pBVar4 = (BamIndex *)operator_new(0x68);
      BamStandardIndex::BamStandardIndex
                ((BamStandardIndex *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      local_8 = pBVar4;
    }
    else {
      BamToolsIndex::Extension_abi_cxx11_();
      bVar2 = std::operator==(&local_38,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90);
      std::__cxx11::string::~string(local_90);
      if ((bVar2 & 1) == 0) {
        local_8 = (BamIndex *)0x0;
      }
      else {
        pBVar4 = (BamIndex *)operator_new(0x68);
        BamToolsIndex::BamToolsIndex
                  ((BamToolsIndex *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        local_8 = pBVar4;
      }
    }
  }
  else {
    local_8 = (BamIndex *)0x0;
  }
  local_3c = 1;
  std::__cxx11::string::~string((string *)&local_38);
  return local_8;
}

Assistant:

BamIndex* BamIndexFactory::CreateIndexFromFilename(const std::string& indexFilename,
                                                   BamReaderPrivate* reader)
{

    // get file extension from index filename, including dot (".EXT")
    // if can't get file extension, return null index
    const std::string extension = FileExtension(indexFilename);
    if (extension.empty()) return 0;

    // create index based on extension
    if (extension == BamStandardIndex::Extension())
        return new BamStandardIndex(reader);
    else if (extension == BamToolsIndex::Extension())
        return new BamToolsIndex(reader);
    else
        return 0;
}